

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_exec(sqlite3 *db,char *zSql,sqlite3_callback xCallback,void *pArg,char **pzErrMsg)

{
  byte *pbVar1;
  ushort uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  char **p;
  char *pcVar6;
  uchar *puVar7;
  Mem *pMVar8;
  char **ppcVar9;
  sqlite3 *db_00;
  Vdbe *p_00;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  sqlite3_stmt *pStmt;
  char *zLeftover;
  Vdbe *local_70;
  uint local_64;
  sqlite3 *local_60;
  char **local_58;
  char *local_50;
  sqlite3_callback local_48;
  ulong local_40;
  void *local_38;
  
  local_70 = (Vdbe *)0x0;
  local_58 = pzErrMsg;
  local_48 = xCallback;
  local_38 = pArg;
  iVar4 = sqlite3SafetyCheckOk(db);
  if (iVar4 == 0) {
    uVar5 = 0x15;
    sqlite3_log(0x15,"%s at line %d of [%.10s]","misuse",0x1cb04,
                "fb90e7189ae6d62e77ba3a308ca5d683f90bbe633cf681865365b8e92792d1c7");
  }
  else {
    pcVar6 = "";
    if (zSql != (char *)0x0) {
      pcVar6 = zSql;
    }
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
    }
    db->errCode = 0;
    local_60 = db;
    if (db->pErr != (sqlite3_value *)0x0) {
      sqlite3ErrorFinish(db,0);
    }
    while( true ) {
      if (*pcVar6 == '\0') break;
      local_70 = (Vdbe *)0x0;
      uVar5 = sqlite3LockAndPrepare
                        (db,pcVar6,-1,0x80,(Vdbe *)0x0,(sqlite3_stmt **)&local_70,&local_50);
      if (uVar5 != 0) goto LAB_001360d9;
      if (local_70 == (Vdbe *)0x0) {
        uVar5 = 0;
        pcVar6 = local_50;
      }
      else {
        uVar2 = local_70->nResColumn;
        uVar10 = (ulong)uVar2;
        local_40 = (ulong)uVar2 << 4 | 8;
        p = (char **)0x0;
        bVar3 = false;
        ppcVar9 = (char **)0x0;
        do {
          p_00 = local_70;
          uVar5 = sqlite3_step((sqlite3_stmt *)local_70);
          if (local_48 != (sqlite3_callback)0x0) {
            local_64 = uVar5;
            if (uVar5 == 100) {
              if (!bVar3) goto LAB_00135edb;
LAB_00135f1d:
              ppcVar9 = p + uVar10;
              if (uVar10 == 0) {
                uVar11 = 0;
              }
              else {
                uVar12 = 0;
                do {
                  puVar7 = sqlite3_column_text((sqlite3_stmt *)local_70,(int)uVar12);
                  p_00 = local_70;
                  ppcVar9[uVar12] = (char *)puVar7;
                  if (puVar7 == (uchar *)0x0) {
                    pMVar8 = columnMem((sqlite3_stmt *)local_70,(int)uVar12);
                    uVar5._0_2_ = pMVar8->flags;
                    uVar5._2_1_ = pMVar8->enc;
                    uVar5._3_1_ = pMVar8->eSubtype;
                    columnMallocFailure((sqlite3_stmt *)p_00);
                    if ((0xaaaaaaaaU >> (uVar5 & 0x1f) & 1) == 0) {
                      if ((local_60->mallocFailed == '\0') && (local_60->bBenignMalloc == '\0')) {
                        local_60->mallocFailed = '\x01';
                        if (0 < local_60->nVdbeExec) {
                          (local_60->u1).isInterrupted = 1;
                        }
                        (local_60->lookaside).bDisable = (local_60->lookaside).bDisable + 1;
                      }
                      uVar5 = 100;
                      goto LAB_001360e6;
                    }
                  }
                  uVar12 = uVar12 + 1;
                  uVar11 = uVar10;
                } while (uVar10 != uVar12);
              }
              ppcVar9[uVar11] = (char *)0x0;
            }
            else {
              if (((uVar5 != 0x65) || (bVar3)) || ((local_60->flags & 0x100) == 0)) break;
LAB_00135edb:
              p = (char **)sqlite3DbMallocRawNN(local_60,local_40);
              if (p == (char **)0x0) {
                p = (char **)0x0;
                uVar5 = local_64;
                goto LAB_001360e6;
              }
              if (uVar10 != 0) {
                uVar11 = 0;
                do {
                  pcVar6 = sqlite3_column_name((sqlite3_stmt *)p_00,(int)uVar11);
                  p[uVar11] = pcVar6;
                  uVar11 = uVar11 + 1;
                } while (uVar10 != uVar11);
              }
              if (local_64 == 100) goto LAB_00135f1d;
            }
            iVar4 = (*local_48)(local_38,(uint)uVar2,ppcVar9,p);
            bVar3 = true;
            uVar5 = local_64;
            if (iVar4 != 0) {
              sqlite3VdbeFinalize(local_70);
              db_00 = local_60;
              local_70 = (Vdbe *)0x0;
              local_60->errCode = 4;
              sqlite3ErrorFinish(local_60,4);
              uVar5 = 4;
              ppcVar9 = local_58;
              goto LAB_001360fd;
            }
          }
          p_00 = local_70;
        } while (uVar5 == 100);
        uVar5 = sqlite3VdbeFinalize(p_00);
        db = local_60;
        local_70 = (Vdbe *)0x0;
        pcVar6 = local_50 + -1;
        do {
          pbVar1 = (byte *)(pcVar6 + 1);
          pcVar6 = pcVar6 + 1;
        } while ((""[*pbVar1] & 1) != 0);
        if (p != (char **)0x0) {
          sqlite3DbFreeNN(local_60,p);
        }
      }
      if (uVar5 != 0) goto LAB_001360d9;
    }
    uVar5 = 0;
LAB_001360d9:
    p = (char **)0x0;
    p_00 = local_70;
LAB_001360e6:
    ppcVar9 = local_58;
    if (p_00 != (Vdbe *)0x0) {
      sqlite3VdbeFinalize(p_00);
    }
    db_00 = local_60;
    if (p != (char **)0x0) {
LAB_001360fd:
      sqlite3DbFreeNN(db_00,p);
    }
    if ((uVar5 == 0xc0a) || (db_00->mallocFailed != '\0')) {
      apiOomError(db_00);
      uVar5 = 7;
    }
    else {
      uVar5 = uVar5 & db_00->errMask;
    }
    if ((ppcVar9 == (char **)0x0) || (uVar5 == 0)) {
      if (ppcVar9 != (char **)0x0) {
        *ppcVar9 = (char *)0x0;
      }
    }
    else {
      pcVar6 = sqlite3_errmsg(db_00);
      pcVar6 = sqlite3DbStrDup((sqlite3 *)0x0,pcVar6);
      *ppcVar9 = pcVar6;
      if (pcVar6 == (char *)0x0) {
        db_00->errCode = 7;
        uVar5 = 7;
        sqlite3ErrorFinish(db_00,7);
      }
    }
    if (db_00->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db_00->mutex);
    }
  }
  return uVar5;
}

Assistant:

SQLITE_API int sqlite3_exec(
  sqlite3 *db,                /* The database on which the SQL executes */
  const char *zSql,           /* The SQL to be executed */
  sqlite3_callback xCallback, /* Invoke this callback routine */
  void *pArg,                 /* First argument to xCallback() */
  char **pzErrMsg             /* Write error messages here */
){
  int rc = SQLITE_OK;         /* Return code */
  const char *zLeftover;      /* Tail of unprocessed SQL */
  sqlite3_stmt *pStmt = 0;    /* The current SQL statement */
  char **azCols = 0;          /* Names of result columns */
  int callbackIsInit;         /* True if callback data is initialized */

  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
  if( zSql==0 ) zSql = "";

  sqlite3_mutex_enter(db->mutex);
  sqlite3Error(db, SQLITE_OK);
  while( rc==SQLITE_OK && zSql[0] ){
    int nCol;
    char **azVals = 0;

    pStmt = 0;
    rc = sqlite3_prepare_v2(db, zSql, -1, &pStmt, &zLeftover);
    assert( rc==SQLITE_OK || pStmt==0 );
    if( rc!=SQLITE_OK ){
      continue;
    }
    if( !pStmt ){
      /* this happens for a comment or white-space */
      zSql = zLeftover;
      continue;
    }

    callbackIsInit = 0;
    nCol = sqlite3_column_count(pStmt);

    while( 1 ){
      int i;
      rc = sqlite3_step(pStmt);

      /* Invoke the callback function if required */
      if( xCallback && (SQLITE_ROW==rc || 
          (SQLITE_DONE==rc && !callbackIsInit
                           && db->flags&SQLITE_NullCallback)) ){
        if( !callbackIsInit ){
          azCols = sqlite3DbMallocRaw(db, (2*nCol+1)*sizeof(const char*));
          if( azCols==0 ){
            goto exec_out;
          }
          for(i=0; i<nCol; i++){
            azCols[i] = (char *)sqlite3_column_name(pStmt, i);
            /* sqlite3VdbeSetColName() installs column names as UTF8
            ** strings so there is no way for sqlite3_column_name() to fail. */
            assert( azCols[i]!=0 );
          }
          callbackIsInit = 1;
        }
        if( rc==SQLITE_ROW ){
          azVals = &azCols[nCol];
          for(i=0; i<nCol; i++){
            azVals[i] = (char *)sqlite3_column_text(pStmt, i);
            if( !azVals[i] && sqlite3_column_type(pStmt, i)!=SQLITE_NULL ){
              sqlite3OomFault(db);
              goto exec_out;
            }
          }
          azVals[i] = 0;
        }
        if( xCallback(pArg, nCol, azVals, azCols) ){
          /* EVIDENCE-OF: R-38229-40159 If the callback function to
          ** sqlite3_exec() returns non-zero, then sqlite3_exec() will
          ** return SQLITE_ABORT. */
          rc = SQLITE_ABORT;
          sqlite3VdbeFinalize((Vdbe *)pStmt);
          pStmt = 0;
          sqlite3Error(db, SQLITE_ABORT);
          goto exec_out;
        }
      }

      if( rc!=SQLITE_ROW ){
        rc = sqlite3VdbeFinalize((Vdbe *)pStmt);
        pStmt = 0;
        zSql = zLeftover;
        while( sqlite3Isspace(zSql[0]) ) zSql++;
        break;
      }
    }

    sqlite3DbFree(db, azCols);
    azCols = 0;
  }

exec_out:
  if( pStmt ) sqlite3VdbeFinalize((Vdbe *)pStmt);
  sqlite3DbFree(db, azCols);

  rc = sqlite3ApiExit(db, rc);
  if( rc!=SQLITE_OK && pzErrMsg ){
    *pzErrMsg = sqlite3DbStrDup(0, sqlite3_errmsg(db));
    if( *pzErrMsg==0 ){
      rc = SQLITE_NOMEM_BKPT;
      sqlite3Error(db, SQLITE_NOMEM);
    }
  }else if( pzErrMsg ){
    *pzErrMsg = 0;
  }

  assert( (rc&db->errMask)==rc );
  sqlite3_mutex_leave(db->mutex);
  return rc;
}